

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

bool ghc::filesystem::is_empty(path *p)

{
  bool bVar1;
  uintmax_t uVar2;
  directory_iterator local_30;
  directory_iterator local_20;
  
  bVar1 = is_directory(p);
  if (bVar1) {
    directory_iterator::directory_iterator(&local_20,p);
    directory_iterator::directory_iterator(&local_30);
    bVar1 = operator==(&((local_20._impl.
                          super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->_dir_entry)._path,
                       &((local_30._impl.
                          super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->_dir_entry)._path);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_30._impl.
                super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_20._impl.
                super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  else {
    uVar2 = file_size(p);
    bVar1 = uVar2 == 0;
  }
  return bVar1;
}

Assistant:

GHC_INLINE bool is_empty(const path& p)
{
    if (is_directory(p)) {
        return directory_iterator(p) == directory_iterator();
    }
    else {
        return file_size(p) == 0;
    }
}